

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

void __thiscall
mp::BasicExprFactory<std::allocator<char>_>::
BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
::AddArg(BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
         *this,Arg arg)

{
  int iVar1;
  AssertionFailure *this_00;
  
  iVar1 = this->arg_index_;
  if (iVar1 < this->impl_->num_args) {
    if (arg.super_ExprBase.impl_ != (Impl *)0x0) {
      this->arg_index_ = iVar1 + 1;
      this->impl_->args[iVar1] = (Impl *)arg.super_ExprBase.impl_;
      return;
    }
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid argument");
  }
  else {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"too many arguments");
  }
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void AddArg(typename ExprType::Arg arg) {
      MP_ASSERT(arg_index_ < impl_->num_args, "too many arguments");
      MP_ASSERT(arg != 0, "invalid argument");
      impl_->args[arg_index_++] = arg.impl();
    }